

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

int __thiscall ncnn::InnerProduct::load_model(InnerProduct *this,ModelBin *mb)

{
  int *piVar1;
  void **ppvVar2;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  Option opt_q;
  Mat weight_data_int8;
  Mat weight_data_r2;
  int num_input;
  Option *in_stack_fffffffffffff980;
  bool local_631;
  Allocator *in_stack_fffffffffffffa18;
  long *in_stack_fffffffffffffa20;
  int _w;
  undefined7 in_stack_fffffffffffffa28;
  undefined1 in_stack_fffffffffffffa2f;
  bool local_5a1;
  void *local_580;
  Option *in_stack_fffffffffffffa88;
  Mat *in_stack_fffffffffffffa90;
  Mat *in_stack_fffffffffffffa98;
  Mat *in_stack_fffffffffffffaa0;
  void *local_4f0;
  int *local_4e8;
  undefined8 local_4e0;
  undefined4 local_4d8;
  long *local_4d0;
  undefined4 local_4c8;
  undefined4 local_4c4;
  undefined4 local_4c0;
  undefined4 local_4bc;
  int local_4b8;
  long local_4b0;
  void *local_4a8;
  int *local_4a0;
  long *local_488;
  int local_45c;
  void *local_458;
  int *local_450;
  undefined8 local_448;
  undefined4 local_440;
  long *local_438;
  undefined4 local_430;
  undefined4 local_42c;
  undefined4 local_428;
  undefined4 local_424;
  undefined4 local_420;
  undefined8 local_418;
  void *local_410;
  int *local_408;
  undefined8 local_400;
  undefined4 local_3f8;
  long *local_3f0;
  undefined4 local_3e8;
  undefined4 local_3e4;
  undefined4 local_3e0;
  undefined4 local_3dc;
  undefined4 local_3d8;
  undefined8 local_3d0;
  void *local_3c8;
  int *local_3c0;
  undefined8 local_3b8;
  undefined4 local_3b0;
  long *local_3a8;
  undefined4 local_3a0;
  undefined4 local_39c;
  undefined4 local_398;
  undefined4 local_394;
  undefined4 local_390;
  undefined8 local_388;
  void *local_370;
  int *local_368;
  undefined8 local_360;
  undefined4 local_358;
  long *local_350;
  undefined4 local_348;
  undefined4 local_344;
  undefined4 local_340;
  undefined4 local_33c;
  undefined4 local_338;
  undefined8 local_330;
  long *local_328;
  int local_314;
  void **local_310;
  void **local_308;
  void **local_2f8;
  void **local_2e8;
  void **local_2d8;
  void **local_2c8;
  void **local_2b8;
  void **local_2a8;
  int local_298;
  undefined4 local_294;
  void **local_290;
  void **local_288;
  void **local_280;
  int local_278;
  undefined4 local_274;
  void **local_270;
  void **local_268;
  void **local_260;
  int local_258;
  undefined4 local_254;
  void **local_250;
  void **local_248;
  void **local_240;
  int local_238;
  undefined4 local_234;
  void **local_230;
  void **local_228;
  void **local_220;
  int local_218;
  undefined4 local_214;
  void **local_210;
  void **local_208;
  void **local_200;
  void **local_1f8;
  long *local_1f0;
  long *local_1e8;
  int local_1e0;
  undefined4 local_1dc;
  void **local_1d8;
  int local_1d0;
  undefined4 local_1cc;
  void **local_1c8;
  int local_1c0;
  undefined4 local_1bc;
  void **local_1b8;
  int local_1b0;
  undefined4 local_1ac;
  void **local_1a8;
  int local_1a0;
  undefined4 local_19c;
  void **local_198;
  int local_180;
  undefined4 local_17c;
  void **local_178;
  int local_160;
  undefined4 local_15c;
  void **local_158;
  int local_140;
  undefined4 local_13c;
  void **local_138;
  int local_120;
  undefined4 local_11c;
  void **local_118;
  int local_100;
  undefined4 local_fc;
  void **local_f8;
  int local_e0;
  undefined4 local_dc;
  void **local_d8;
  int local_c0;
  undefined4 local_bc;
  void **local_b8;
  void *local_60;
  void *local_40;
  void *local_38;
  void *local_30;
  void *local_28;
  void *local_20;
  long *local_18;
  long *local_10;
  void **local_8;
  
  local_328 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(&local_370,in_RSI,*(undefined4 *)(in_RDI + 0xd8),0);
  ppvVar2 = (void **)(in_RDI + 0x130);
  local_210 = &local_370;
  local_208 = ppvVar2;
  if (ppvVar2 != local_210) {
    if (local_368 != (int *)0x0) {
      local_214 = 1;
      LOCK();
      local_218 = *local_368;
      *local_368 = *local_368 + 1;
      UNLOCK();
    }
    local_1d8 = ppvVar2;
    if (*(long *)(in_RDI + 0x138) != 0) {
      piVar1 = *(int **)(in_RDI + 0x138);
      local_1dc = 0xffffffff;
      LOCK();
      local_1e0 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_1e0 == 1) {
        if (*(long *)(in_RDI + 0x150) == 0) {
          local_20 = *ppvVar2;
          if (local_20 != (void *)0x0) {
            free(local_20);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x150) + 0x18))(*(long **)(in_RDI + 0x150),*ppvVar2);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    *(undefined8 *)(in_RDI + 0x140) = 0;
    *(undefined4 *)(in_RDI + 0x148) = 0;
    *(undefined4 *)(in_RDI + 0x158) = 0;
    *(undefined4 *)(in_RDI + 0x15c) = 0;
    *(undefined4 *)(in_RDI + 0x160) = 0;
    *(undefined4 *)(in_RDI + 0x164) = 0;
    *(undefined4 *)(in_RDI + 0x168) = 0;
    *(undefined8 *)(in_RDI + 0x170) = 0;
    *(undefined8 *)(in_RDI + 0x138) = 0;
    *ppvVar2 = *local_210;
    *(void **)(in_RDI + 0x138) = local_210[1];
    *(void **)(in_RDI + 0x140) = local_210[2];
    *(undefined4 *)(in_RDI + 0x148) = *(undefined4 *)(local_210 + 3);
    *(void **)(in_RDI + 0x150) = local_210[4];
    *(undefined4 *)(in_RDI + 0x158) = *(undefined4 *)(local_210 + 5);
    *(undefined4 *)(in_RDI + 0x15c) = *(undefined4 *)((long)local_210 + 0x2c);
    *(undefined4 *)(in_RDI + 0x160) = *(undefined4 *)(local_210 + 6);
    *(undefined4 *)(in_RDI + 0x164) = *(undefined4 *)((long)local_210 + 0x34);
    *(undefined4 *)(in_RDI + 0x168) = *(undefined4 *)(local_210 + 7);
    *(void **)(in_RDI + 0x170) = local_210[8];
  }
  local_308 = &local_370;
  local_200 = ppvVar2;
  local_b8 = local_308;
  if (local_368 != (int *)0x0) {
    local_bc = 0xffffffff;
    LOCK();
    local_c0 = *local_368;
    *local_368 = *local_368 + -1;
    UNLOCK();
    if (local_c0 == 1) {
      if (local_350 == (long *)0x0) {
        if (local_370 != (void *)0x0) {
          free(local_370);
        }
      }
      else {
        (**(code **)(*local_350 + 0x18))(local_350,local_370);
      }
    }
  }
  local_370 = (void *)0x0;
  local_360 = 0;
  local_358 = 0;
  local_348 = 0;
  local_344 = 0;
  local_340 = 0;
  local_33c = 0;
  local_338 = 0;
  local_330 = 0;
  local_368 = (int *)0x0;
  local_1e8 = (long *)(in_RDI + 0x130);
  local_5a1 = true;
  if (*local_1e8 != 0) {
    local_5a1 = *(long *)(in_RDI + 0x170) * (long)*(int *)(in_RDI + 0x168) == 0;
    local_18 = local_1e8;
  }
  if (local_5a1) {
    local_314 = -100;
  }
  else {
    if (*(int *)(in_RDI + 0xd4) != 0) {
      (**(code **)(*local_328 + 0x10))(&local_3c8,local_328,*(undefined4 *)(in_RDI + 0xd0),1);
      ppvVar2 = (void **)(in_RDI + 0x178);
      local_230 = &local_3c8;
      local_228 = ppvVar2;
      if (ppvVar2 != local_230) {
        if (local_3c0 != (int *)0x0) {
          local_234 = 1;
          LOCK();
          local_238 = *local_3c0;
          *local_3c0 = *local_3c0 + 1;
          UNLOCK();
        }
        local_1c8 = ppvVar2;
        if (*(long *)(in_RDI + 0x180) != 0) {
          piVar1 = *(int **)(in_RDI + 0x180);
          local_1cc = 0xffffffff;
          LOCK();
          local_1d0 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_1d0 == 1) {
            if (*(long *)(in_RDI + 0x198) == 0) {
              local_28 = *ppvVar2;
              if (local_28 != (void *)0x0) {
                free(local_28);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x198) + 0x18))(*(long **)(in_RDI + 0x198),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x188) = 0;
        *(undefined4 *)(in_RDI + 400) = 0;
        *(undefined4 *)(in_RDI + 0x1a0) = 0;
        *(undefined4 *)(in_RDI + 0x1a4) = 0;
        *(undefined4 *)(in_RDI + 0x1a8) = 0;
        *(undefined4 *)(in_RDI + 0x1ac) = 0;
        *(undefined4 *)(in_RDI + 0x1b0) = 0;
        *(undefined8 *)(in_RDI + 0x1b8) = 0;
        *(undefined8 *)(in_RDI + 0x180) = 0;
        *ppvVar2 = *local_230;
        *(void **)(in_RDI + 0x180) = local_230[1];
        *(void **)(in_RDI + 0x188) = local_230[2];
        *(undefined4 *)(in_RDI + 400) = *(undefined4 *)(local_230 + 3);
        *(void **)(in_RDI + 0x198) = local_230[4];
        *(undefined4 *)(in_RDI + 0x1a0) = *(undefined4 *)(local_230 + 5);
        *(undefined4 *)(in_RDI + 0x1a4) = *(undefined4 *)((long)local_230 + 0x2c);
        *(undefined4 *)(in_RDI + 0x1a8) = *(undefined4 *)(local_230 + 6);
        *(undefined4 *)(in_RDI + 0x1ac) = *(undefined4 *)((long)local_230 + 0x34);
        *(undefined4 *)(in_RDI + 0x1b0) = *(undefined4 *)(local_230 + 7);
        *(void **)(in_RDI + 0x1b8) = local_230[8];
      }
      local_2f8 = &local_3c8;
      local_220 = ppvVar2;
      local_d8 = local_2f8;
      if (local_3c0 != (int *)0x0) {
        local_dc = 0xffffffff;
        LOCK();
        local_e0 = *local_3c0;
        *local_3c0 = *local_3c0 + -1;
        UNLOCK();
        if (local_e0 == 1) {
          if (local_3a8 == (long *)0x0) {
            if (local_3c8 != (void *)0x0) {
              free(local_3c8);
            }
          }
          else {
            (**(code **)(*local_3a8 + 0x18))(local_3a8,local_3c8);
          }
        }
      }
      local_3c8 = (void *)0x0;
      local_3b8 = 0;
      local_3b0 = 0;
      local_3a0 = 0;
      local_39c = 0;
      local_398 = 0;
      local_394 = 0;
      local_390 = 0;
      local_388 = 0;
      local_3c0 = (int *)0x0;
      in_stack_fffffffffffffa20 = (long *)(in_RDI + 0x178);
      bVar3 = true;
      if (*in_stack_fffffffffffffa20 != 0) {
        bVar3 = *(long *)(in_RDI + 0x1b8) * (long)*(int *)(in_RDI + 0x1b0) == 0;
        local_10 = in_stack_fffffffffffffa20;
      }
      if (bVar3) {
        return -100;
      }
      in_stack_fffffffffffffa2f = 0;
      local_1f0 = in_stack_fffffffffffffa20;
    }
    if (*(int *)(in_RDI + 0xdc) != 0) {
      (**(code **)(*local_328 + 0x10))(&local_410,local_328,*(undefined4 *)(in_RDI + 0xd0),1);
      ppvVar2 = (void **)(in_RDI + 0x1c0);
      local_250 = &local_410;
      local_248 = ppvVar2;
      if (ppvVar2 != local_250) {
        if (local_408 != (int *)0x0) {
          local_254 = 1;
          LOCK();
          local_258 = *local_408;
          *local_408 = *local_408 + 1;
          UNLOCK();
        }
        local_1b8 = ppvVar2;
        if (*(long *)(in_RDI + 0x1c8) != 0) {
          piVar1 = *(int **)(in_RDI + 0x1c8);
          local_1bc = 0xffffffff;
          LOCK();
          local_1c0 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_1c0 == 1) {
            if (*(long *)(in_RDI + 0x1e0) == 0) {
              local_30 = *ppvVar2;
              if (local_30 != (void *)0x0) {
                free(local_30);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x1e0) + 0x18))(*(long **)(in_RDI + 0x1e0),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x1d0) = 0;
        *(undefined4 *)(in_RDI + 0x1d8) = 0;
        *(undefined4 *)(in_RDI + 0x1e8) = 0;
        *(undefined4 *)(in_RDI + 0x1ec) = 0;
        *(undefined4 *)(in_RDI + 0x1f0) = 0;
        *(undefined4 *)(in_RDI + 500) = 0;
        *(undefined4 *)(in_RDI + 0x1f8) = 0;
        *(undefined8 *)(in_RDI + 0x200) = 0;
        *(undefined8 *)(in_RDI + 0x1c8) = 0;
        *ppvVar2 = *local_250;
        *(void **)(in_RDI + 0x1c8) = local_250[1];
        *(void **)(in_RDI + 0x1d0) = local_250[2];
        *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(local_250 + 3);
        *(void **)(in_RDI + 0x1e0) = local_250[4];
        *(undefined4 *)(in_RDI + 0x1e8) = *(undefined4 *)(local_250 + 5);
        *(undefined4 *)(in_RDI + 0x1ec) = *(undefined4 *)((long)local_250 + 0x2c);
        *(undefined4 *)(in_RDI + 0x1f0) = *(undefined4 *)(local_250 + 6);
        *(undefined4 *)(in_RDI + 500) = *(undefined4 *)((long)local_250 + 0x34);
        *(undefined4 *)(in_RDI + 0x1f8) = *(undefined4 *)(local_250 + 7);
        *(void **)(in_RDI + 0x200) = local_250[8];
      }
      local_2e8 = &local_410;
      local_240 = ppvVar2;
      local_f8 = local_2e8;
      if (local_408 != (int *)0x0) {
        local_fc = 0xffffffff;
        LOCK();
        local_100 = *local_408;
        *local_408 = *local_408 + -1;
        UNLOCK();
        if (local_100 == 1) {
          if (local_3f0 == (long *)0x0) {
            if (local_410 != (void *)0x0) {
              free(local_410);
            }
          }
          else {
            (**(code **)(*local_3f0 + 0x18))(local_3f0,local_410);
          }
        }
      }
      local_410 = (void *)0x0;
      local_400 = 0;
      local_3f8 = 0;
      local_3e8 = 0;
      local_3e4 = 0;
      local_3e0 = 0;
      local_3dc = 0;
      local_3d8 = 0;
      local_3d0 = 0;
      local_408 = (int *)0x0;
      (**(code **)(*local_328 + 0x10))(&local_458,local_328,1);
      ppvVar2 = (void **)(in_RDI + 0x208);
      local_270 = &local_458;
      local_268 = ppvVar2;
      if (ppvVar2 != local_270) {
        if (local_450 != (int *)0x0) {
          local_274 = 1;
          LOCK();
          local_278 = *local_450;
          *local_450 = *local_450 + 1;
          UNLOCK();
        }
        local_1a8 = ppvVar2;
        if (*(long *)(in_RDI + 0x210) != 0) {
          piVar1 = *(int **)(in_RDI + 0x210);
          local_1ac = 0xffffffff;
          LOCK();
          local_1b0 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_1b0 == 1) {
            if (*(long *)(in_RDI + 0x228) == 0) {
              local_38 = *ppvVar2;
              if (local_38 != (void *)0x0) {
                free(local_38);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x228) + 0x18))(*(long **)(in_RDI + 0x228),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0x218) = 0;
        *(undefined4 *)(in_RDI + 0x220) = 0;
        *(undefined4 *)(in_RDI + 0x230) = 0;
        *(undefined4 *)(in_RDI + 0x234) = 0;
        *(undefined4 *)(in_RDI + 0x238) = 0;
        *(undefined4 *)(in_RDI + 0x23c) = 0;
        *(undefined4 *)(in_RDI + 0x240) = 0;
        *(undefined8 *)(in_RDI + 0x248) = 0;
        *(undefined8 *)(in_RDI + 0x210) = 0;
        *ppvVar2 = *local_270;
        *(void **)(in_RDI + 0x210) = local_270[1];
        *(void **)(in_RDI + 0x218) = local_270[2];
        *(undefined4 *)(in_RDI + 0x220) = *(undefined4 *)(local_270 + 3);
        *(void **)(in_RDI + 0x228) = local_270[4];
        *(undefined4 *)(in_RDI + 0x230) = *(undefined4 *)(local_270 + 5);
        *(undefined4 *)(in_RDI + 0x234) = *(undefined4 *)((long)local_270 + 0x2c);
        *(undefined4 *)(in_RDI + 0x238) = *(undefined4 *)(local_270 + 6);
        *(undefined4 *)(in_RDI + 0x23c) = *(undefined4 *)((long)local_270 + 0x34);
        *(undefined4 *)(in_RDI + 0x240) = *(undefined4 *)(local_270 + 7);
        *(void **)(in_RDI + 0x248) = local_270[8];
      }
      local_2d8 = &local_458;
      local_260 = ppvVar2;
      local_118 = local_2d8;
      if (local_450 != (int *)0x0) {
        local_11c = 0xffffffff;
        LOCK();
        local_120 = *local_450;
        *local_450 = *local_450 + -1;
        UNLOCK();
        if (local_120 == 1) {
          if (local_438 == (long *)0x0) {
            if (local_458 != (void *)0x0) {
              free(local_458);
            }
          }
          else {
            (**(code **)(*local_438 + 0x18))(local_438,local_458);
          }
        }
      }
      local_458 = (void *)0x0;
      local_448 = 0;
      local_440 = 0;
      local_430 = 0;
      local_42c = 0;
      local_428 = 0;
      local_424 = 0;
      local_420 = 0;
      local_418 = 0;
      local_450 = (int *)0x0;
    }
    if ((*(long *)(in_RDI + 0x140) == 4) && (*(int *)(in_RDI + 0xdc) != 0)) {
      local_45c = *(int *)(in_RDI + 0xd8) / *(int *)(in_RDI + 0xd0);
      Mat::reshape((Mat *)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28),
                   (int)((ulong)in_stack_fffffffffffffa20 >> 0x20),(int)in_stack_fffffffffffffa20,
                   in_stack_fffffffffffffa18);
      _w = (int)((ulong)in_stack_fffffffffffffa20 >> 0x20);
      local_310 = &local_4f0;
      local_4f0 = (void *)0x0;
      local_4e8 = (int *)0x0;
      local_4e0 = 0;
      local_4d8 = 0;
      local_4d0 = (long *)0x0;
      local_4c8 = 0;
      local_4c4 = 0;
      local_4c0 = 0;
      local_4bc = 0;
      local_4b8 = 0;
      local_4b0 = 0;
      Option::Option(in_stack_fffffffffffff980);
      quantize_to_int8(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90
                       ,in_stack_fffffffffffffa88);
      local_1f8 = &local_4f0;
      if (local_4f0 != (void *)0x0) {
        local_8 = local_1f8;
      }
      local_631 = local_4f0 != (void *)0x0 && local_4b0 * local_4b8 != 0;
      if (local_631) {
        Mat::reshape((Mat *)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28),_w,
                     in_stack_fffffffffffffa18);
        ppvVar2 = (void **)(in_RDI + 0x130);
        local_290 = &local_580;
        local_288 = ppvVar2;
        if (ppvVar2 != local_290) {
          if (in_stack_fffffffffffffa88 != (Option *)0x0) {
            local_294 = 1;
            LOCK();
            local_298._0_1_ = in_stack_fffffffffffffa88->lightmode;
            local_298._1_1_ = in_stack_fffffffffffffa88->use_shader_pack8;
            local_298._2_1_ = in_stack_fffffffffffffa88->use_subgroup_ops;
            local_298._3_1_ = in_stack_fffffffffffffa88->use_reserved_0;
            *(int *)in_stack_fffffffffffffa88 = *(int *)in_stack_fffffffffffffa88 + 1;
            UNLOCK();
          }
          local_198 = ppvVar2;
          if (*(long *)(in_RDI + 0x138) != 0) {
            piVar1 = *(int **)(in_RDI + 0x138);
            local_19c = 0xffffffff;
            LOCK();
            local_1a0 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_1a0 == 1) {
              if (*(long *)(in_RDI + 0x150) == 0) {
                local_40 = *ppvVar2;
                if (local_40 != (void *)0x0) {
                  free(local_40);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x150) + 0x18))
                          (*(long **)(in_RDI + 0x150),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x140) = 0;
          *(undefined4 *)(in_RDI + 0x148) = 0;
          *(undefined4 *)(in_RDI + 0x158) = 0;
          *(undefined4 *)(in_RDI + 0x15c) = 0;
          *(undefined4 *)(in_RDI + 0x160) = 0;
          *(undefined4 *)(in_RDI + 0x164) = 0;
          *(undefined4 *)(in_RDI + 0x168) = 0;
          *(undefined8 *)(in_RDI + 0x170) = 0;
          *(undefined8 *)(in_RDI + 0x138) = 0;
          *ppvVar2 = *local_290;
          *(void **)(in_RDI + 0x138) = local_290[1];
          *(void **)(in_RDI + 0x140) = local_290[2];
          *(undefined4 *)(in_RDI + 0x148) = *(undefined4 *)(local_290 + 3);
          *(void **)(in_RDI + 0x150) = local_290[4];
          *(undefined4 *)(in_RDI + 0x158) = *(undefined4 *)(local_290 + 5);
          *(undefined4 *)(in_RDI + 0x15c) = *(undefined4 *)((long)local_290 + 0x2c);
          *(undefined4 *)(in_RDI + 0x160) = *(undefined4 *)(local_290 + 6);
          *(undefined4 *)(in_RDI + 0x164) = *(undefined4 *)((long)local_290 + 0x34);
          *(undefined4 *)(in_RDI + 0x168) = *(undefined4 *)(local_290 + 7);
          *(void **)(in_RDI + 0x170) = local_290[8];
        }
        local_2c8 = &local_580;
        local_280 = ppvVar2;
        local_138 = local_2c8;
        if (in_stack_fffffffffffffa88 != (Option *)0x0) {
          local_13c = 0xffffffff;
          LOCK();
          local_140._0_1_ = in_stack_fffffffffffffa88->lightmode;
          local_140._1_1_ = in_stack_fffffffffffffa88->use_shader_pack8;
          local_140._2_1_ = in_stack_fffffffffffffa88->use_subgroup_ops;
          local_140._3_1_ = in_stack_fffffffffffffa88->use_reserved_0;
          *(int *)in_stack_fffffffffffffa88 = *(int *)in_stack_fffffffffffffa88 + -1;
          UNLOCK();
          if (local_140 == 1) {
            if (in_stack_fffffffffffffaa0 == (Mat *)0x0) {
              if (local_580 != (void *)0x0) {
                free(local_580);
              }
            }
            else {
              (**(code **)((long)in_stack_fffffffffffffaa0->data + 0x18))
                        (in_stack_fffffffffffffaa0,local_580);
            }
          }
        }
        local_580 = (void *)0x0;
        bVar3 = false;
      }
      else {
        local_314 = -100;
        bVar3 = true;
      }
      local_2b8 = &local_4f0;
      local_158 = local_2b8;
      if (local_4e8 != (int *)0x0) {
        local_15c = 0xffffffff;
        LOCK();
        local_160 = *local_4e8;
        *local_4e8 = *local_4e8 + -1;
        UNLOCK();
        if (local_160 == 1) {
          if (local_4d0 == (long *)0x0) {
            local_60 = local_4f0;
            if (local_4f0 != (void *)0x0) {
              free(local_4f0);
            }
          }
          else {
            (**(code **)(*local_4d0 + 0x18))(local_4d0,local_4f0);
          }
        }
      }
      local_4f0 = (void *)0x0;
      local_4e0 = 0;
      local_4d8 = 0;
      local_4c8 = 0;
      local_4c4 = 0;
      local_4c0 = 0;
      local_4bc = 0;
      local_4b8 = 0;
      local_4b0 = 0;
      local_4e8 = (int *)0x0;
      local_2a8 = &local_4a8;
      if (local_4a0 != (int *)0x0) {
        local_17c = 0xffffffff;
        LOCK();
        local_180 = *local_4a0;
        *local_4a0 = *local_4a0 + -1;
        UNLOCK();
        if (local_180 == 1) {
          local_178 = local_2a8;
          if (local_488 == (long *)0x0) {
            if (local_4a8 != (void *)0x0) {
              free(local_4a8);
            }
          }
          else {
            (**(code **)(*local_488 + 0x18))(local_488,local_4a8);
          }
        }
      }
      if (bVar3) {
        return local_314;
      }
    }
    local_314 = 0;
  }
  return local_314;
}

Assistant:

int InnerProduct::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term)
    {
        weight_data_int8_scales = mb.load(num_output, 1);
        bottom_blob_int8_scales = mb.load(1, 1);
    }
#endif // NCNN_INT8

#if NCNN_INT8
    // runtime quantize the weight data
    if (weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        const int num_input = weight_data_size / num_output;

        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

        Mat weight_data_int8;
        Option opt_q;
        opt_q.num_threads = 1;
        opt_q.use_packing_layout = false;
        quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
        if (weight_data_int8.empty())
            return -100;

        weight_data = weight_data_int8.reshape(weight_data_size);
    }
#endif // NCNN_INT8

    return 0;
}